

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O2

void __thiscall
ktx::OptionsTranscodeTarget<false>::validateTextureTranscode
          (OptionsTranscodeTarget<false> *this,KTXTexture2 *texture,Reporter *report)

{
  TranscodeSwizzleInfo tswizzle;
  undefined1 local_38 [40];
  
  determineTranscodeSwizzle((TranscodeSwizzleInfo *)local_38,texture,report);
  if ((this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
      super__Optional_payload_base<ktx_transcode_fmt_e>._M_engaged == false) {
    (this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
    super__Optional_payload_base<ktx_transcode_fmt_e> =
         (_Optional_payload_base<ktx_transcode_fmt_e>)0x10000000d;
    std::__cxx11::string::assign((char *)&this->transcodeTargetName);
    this->transcodeSwizzleComponents = local_38._0_4_;
  }
  std::__cxx11::string::_M_assign((string *)&this->transcodeSwizzle);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void validateTextureTranscode(const KTXTexture2& texture, Reporter& report) {
        const auto tswizzle = determineTranscodeSwizzle(texture, report);

        if (!transcodeTarget.has_value()) {
            transcodeTarget = KTX_TTF_RGBA32;
            transcodeTargetName = "rgba8";
            transcodeSwizzleComponents = tswizzle.defaultNumComponents;
        }

        transcodeSwizzle = tswizzle.swizzle;
    }